

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wordset.cpp
# Opt level: O0

void set_priority(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *v,string *word)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  reference pbVar4;
  long lVar5;
  long lVar6;
  const_reference __x;
  undefined1 local_150 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  compound;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [36];
  int local_a4;
  string local_a0 [4];
  int priority;
  string str;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_58;
  undefined1 local_40 [8];
  priority_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_iamareebjamal[P]spell_correct_cpp_wordset_cpp:134:20)>
  result;
  anon_class_1_0_00000001 compare;
  string *word_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v_local;
  
  local_58.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::vector(&local_58);
  std::
  priority_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/iamareebjamal[P]spell-correct-cpp/wordset.cpp:134:20)>
  ::priority_queue((priority_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_iamareebjamal[P]spell_correct_cpp_wordset_cpp:134:20)>
                    *)local_40,(anon_class_1_0_00000001 *)&result.field_0x1f,&local_58);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector(&local_58);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(v);
  local_80._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(v);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&local_80), bVar1) {
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_a0,(string *)pbVar4);
    local_a4 = 0;
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a0,word);
    if (_Var2) {
      local_a4 = local_a4 + 10;
    }
    std::__cxx11::string::string(local_c8,local_a0);
    std::__cxx11::string::string(local_e8,(string *)word);
    bVar1 = is_weak_anagram((string *)local_c8,(string *)local_e8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_c8);
    if (bVar1) {
      local_a4 = local_a4 + 5;
    }
    lVar5 = std::__cxx11::string::length();
    lVar6 = std::__cxx11::string::length();
    if (lVar5 == lVar6) {
      local_a4 = local_a4 + 1;
    }
    std::__cxx11::string::string(local_108,local_a0);
    std::__cxx11::string::string((string *)&compound.second,(string *)word);
    iVar3 = common_prefix_len((string *)local_108,(string *)&compound.second);
    local_a4 = local_a4 + iVar3 * 2;
    std::__cxx11::string::~string((string *)&compound.second);
    std::__cxx11::string::~string(local_108);
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)local_150,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
               &local_a4);
    std::
    priority_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/iamareebjamal[P]spell-correct-cpp/wordset.cpp:134:20)>
    ::push((priority_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_iamareebjamal[P]spell_correct_cpp_wordset_cpp:134:20)>
            *)local_40,(value_type *)local_150);
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *)local_150);
    std::__cxx11::string::~string(local_a0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(v);
  while (bVar1 = std::
                 priority_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/iamareebjamal[P]spell-correct-cpp/wordset.cpp:134:20)>
                 ::empty((priority_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_iamareebjamal[P]spell_correct_cpp_wordset_cpp:134:20)>
                          *)local_40), ((bVar1 ^ 0xffU) & 1) != 0) {
    __x = std::
          priority_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/iamareebjamal[P]spell-correct-cpp/wordset.cpp:134:20)>
          ::top((priority_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_iamareebjamal[P]spell_correct_cpp_wordset_cpp:134:20)>
                 *)local_40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(v,&__x->first);
    std::
    priority_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/iamareebjamal[P]spell-correct-cpp/wordset.cpp:134:20)>
    ::pop((priority_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_iamareebjamal[P]spell_correct_cpp_wordset_cpp:134:20)>
           *)local_40);
  }
  std::
  priority_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/iamareebjamal[P]spell-correct-cpp/wordset.cpp:134:20)>
  ::~priority_queue((priority_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_iamareebjamal[P]spell_correct_cpp_wordset_cpp:134:20)>
                     *)local_40);
  return;
}

Assistant:

void set_priority(vector<string>& v, const string& word){

    auto compare = [](pair<string, int> left, pair<string, int> right) {
        return right.second > left.second;
    };

    priority_queue<
            pair<string, int>,
            vector<pair<string, int>>,
            decltype(compare) >
    result(compare);

    for(string str : v) {
        int priority = 0;

        if(str == word)
            priority += 10;

        if(is_weak_anagram(str, word))
            priority += 5;

        if(str.length() == word.length())
            priority += 1;

        priority += 2*common_prefix_len(str, word);

        pair<string, int> compound = pair<string, int>(str, priority);
        result.push(compound);
    }

    v.clear();
    while(!result.empty()) {
        v.push_back(result.top().first);
        result.pop();
    }

}